

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CService * GetLocalAddress(CService *__return_storage_ptr__,CNode *peer)

{
  _Base_ptr this;
  _Rb_tree_color _Var1;
  uint16_t portIn;
  Network NVar2;
  Network NVar3;
  int iVar4;
  _Base_ptr p_Var5;
  int iVar6;
  long in_FS_OFFSET;
  _Rb_tree_color local_cc;
  UniqueLock<GlobalMutex> criticalblock16;
  _Optional_payload_base<CService> local_90;
  CService local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90._M_engaged = false;
  if (fListen) {
    UniqueLock<GlobalMutex>::UniqueLock
              (&criticalblock16,&g_maplocalhost_mutex,"g_maplocalhost_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
               0xaa,false);
    iVar6 = -1;
    local_cc = ~_S_red;
    for (p_Var5 = mapLocalHost._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &mapLocalHost._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      this = p_Var5 + 1;
      NVar2 = CNetAddr::GetNetwork((CNetAddr *)this);
      NVar3 = CNode::ConnectedThroughNetwork(peer);
      if ((NVar2 == NVar3) ||
         (((1 < *(int *)&p_Var5[1]._M_right - 3U && (peer->m_inbound_onion == false)) &&
          (1 < (peer->addr).super_CService.super_CNetAddr.m_net - NET_ONION)))) {
        _Var1 = p_Var5[2]._M_color;
        iVar4 = CNetAddr::GetReachabilityFrom((CNetAddr *)this,(CNetAddr *)&peer->addr);
        if ((iVar6 < iVar4) || ((iVar4 == iVar6 && ((int)local_cc < (int)_Var1)))) {
          CService::CService(&local_60,(CNetAddr *)this,*(uint16_t *)&p_Var5[2].field_0x4);
          std::optional<CService>::emplace<CService>((optional<CService> *)&local_90,&local_60);
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_60);
          local_cc = _Var1;
          iVar6 = iVar4;
        }
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock16.super_unique_lock);
  }
  CNetAddr::CNetAddr((CNetAddr *)&criticalblock16);
  portIn = GetListenPort();
  CService::CService(&local_60,(CNetAddr *)&criticalblock16,portIn);
  std::optional<CService>::value_or<CService>
            (__return_storage_ptr__,(optional<CService> *)&local_90,&local_60);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_60);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock16);
  std::_Optional_payload_base<CService>::_M_reset(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

CService GetLocalAddress(const CNode& peer)
{
    return GetLocal(peer).value_or(CService{CNetAddr(), GetListenPort()});
}